

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockAgentTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::testutils::MockAgent_testSamplingManager_Test::TestBody
          (MockAgent_testSamplingManager_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  value_t vVar3;
  char cVar4;
  ostream *poVar5;
  char *pcVar6;
  pointer pbVar7;
  RateLimitingSamplingStrategy rateLimiting;
  __string_type uriStr_3;
  Response response;
  shared_ptr<jaegertracing::testutils::MockAgent> mockAgent;
  URI uri;
  AssertionResult gtest_ar;
  __string_type uriStr;
  __string_type uriStr_2;
  ostringstream oss;
  input_adapter local_4b8;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  input_adapter local_478;
  string local_468;
  undefined1 *local_440;
  undefined1 local_430 [16];
  vector<jaegertracing::net::http::Header,_std::allocator<jaegertracing::net::http::Header>_>
  local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  MockAgent *local_3e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3e0;
  undefined1 local_3d8 [48];
  undefined1 local_3a8 [24];
  undefined1 *local_390;
  undefined1 local_380 [16];
  undefined1 *local_370;
  undefined1 local_360 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_350;
  code *local_340;
  undefined8 local_338;
  code *local_330;
  undefined2 local_328;
  code *local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  byte local_2e8;
  byte local_2e0;
  code **local_2d8;
  type local_2d0 [2];
  code *local_2c8;
  undefined8 local_2c0;
  code *local_2b8;
  undefined2 local_2b0;
  code *local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  byte local_270;
  byte local_268;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_260;
  undefined1 local_250 [104];
  _Any_data local_1e8;
  code *local_1d8;
  undefined8 uStack_1d0;
  _Any_data local_1c8;
  code *local_1b8;
  undefined8 uStack_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  MockAgent::make();
  jaegertracing::testutils::MockAgent::start();
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"http://",7);
  memcpy((IPAddress *)local_3d8,local_3e8 + 0x240,0x88);
  net::IPAddress::authority_abi_cxx11_(&local_468,(IPAddress *)local_3d8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_468._M_dataplus._M_p,local_468._M_string_length);
  local_2d8 = (code **)CONCAT71(local_2d8._1_7_,0x2f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_2d8,1);
  paVar1 = &local_468.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != paVar1) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  jaegertracing::net::URI::parse((string *)local_3d8);
  jaegertracing::net::http::get((URI *)&local_468);
  testing::internal::CmpHelperEQ<char[23],std::__cxx11::string>
            ((internal *)&local_350,"\"no \'service\' parameter\"","response.body()",
             (char (*) [23])"no \'service\' parameter",&local_408);
  if ((internal)local_350.m_type == (internal)0x0) {
    testing::Message::Message((Message *)&local_260);
    if ((undefined8 *)
        CONCAT44(local_350.m_value.number_integer._4_4_,local_350.m_value.number_integer._0_4_) ==
        (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(local_350.m_value.number_integer._4_4_,
                                  local_350.m_value.number_integer._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/MockAgentTest.cpp"
               ,0x53,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4a8,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4a8);
    if (((CONCAT71(local_260._1_7_,local_260.m_type) != 0) &&
        (cVar4 = testing::internal::IsTrue(true), cVar4 != '\0')) &&
       ((long *)CONCAT71(local_260._1_7_,local_260.m_type) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_260._1_7_,local_260.m_type) + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_350.m_value,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    std::vector<jaegertracing::net::http::Header,_std::allocator<jaegertracing::net::http::Header>_>
    ::~vector(&local_420);
    if (local_440 != local_430) {
      operator_delete(local_440);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != paVar1) {
      operator_delete(local_468._M_dataplus._M_p);
    }
    if (local_370 != local_360) {
      operator_delete(local_370);
    }
    if (local_390 != local_380) {
      operator_delete(local_390);
    }
    if ((undefined1 *)local_3d8._32_8_ != local_3a8) {
      operator_delete((void *)local_3d8._32_8_);
    }
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_);
    }
    if (local_2d8 != &local_2c8) {
LAB_001c3347:
      operator_delete(local_2d8);
    }
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_350.m_value,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    std::vector<jaegertracing::net::http::Header,_std::allocator<jaegertracing::net::http::Header>_>
    ::~vector(&local_420);
    if (local_440 != local_430) {
      operator_delete(local_440);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != paVar1) {
      operator_delete(local_468._M_dataplus._M_p);
    }
    if (local_370 != local_360) {
      operator_delete(local_370);
    }
    if (local_390 != local_380) {
      operator_delete(local_390);
    }
    if ((undefined1 *)local_3d8._32_8_ != local_3a8) {
      operator_delete((void *)local_3d8._32_8_);
    }
    puVar2 = local_3d8 + 0x10;
    if ((undefined1 *)local_3d8._0_8_ != puVar2) {
      operator_delete((void *)local_3d8._0_8_);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"http://",7);
    memcpy((IPAddress *)local_3d8,local_3e8 + 0x240,0x88);
    net::IPAddress::authority_abi_cxx11_(&local_468,(IPAddress *)local_3d8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_468._M_dataplus._M_p,local_468._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/?service=a&service=b",0x15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != paVar1) {
      operator_delete(local_468._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    jaegertracing::net::URI::parse((string *)local_3d8);
    jaegertracing::net::http::get((URI *)&local_468);
    testing::internal::CmpHelperEQ<char[41],std::__cxx11::string>
              ((internal *)&local_350,"\"\'service\' parameter must occur only once\"",
               "response.body()",(char (*) [41])"\'service\' parameter must occur only once",
               &local_408);
    if ((internal)local_350.m_type != (internal)0x0) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_350.m_value,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p);
      }
      std::
      vector<jaegertracing::net::http::Header,_std::allocator<jaegertracing::net::http::Header>_>::
      ~vector(&local_420);
      if (local_440 != local_430) {
        operator_delete(local_440);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != paVar1) {
        operator_delete(local_468._M_dataplus._M_p);
      }
      if (local_370 != local_360) {
        operator_delete(local_370);
      }
      if (local_390 != local_380) {
        operator_delete(local_390);
      }
      if ((undefined1 *)local_3d8._32_8_ != local_3a8) {
        operator_delete((void *)local_3d8._32_8_);
      }
      if ((undefined1 *)local_3d8._0_8_ != puVar2) {
        operator_delete((void *)local_3d8._0_8_);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"http://",7);
      memcpy((IPAddress *)local_3d8,local_3e8 + 0x240,0x88);
      net::IPAddress::authority_abi_cxx11_(&local_468,(IPAddress *)local_3d8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_468._M_dataplus._M_p,local_468._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/?service=something",0x13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != paVar1) {
        operator_delete(local_468._M_dataplus._M_p);
      }
      std::__cxx11::stringbuf::str();
      jaegertracing::net::URI::parse((string *)local_3d8);
      jaegertracing::net::http::get((URI *)&local_468);
      local_2d8 = (code **)std::istream::_M_extract<long>;
      local_2d0[0] = PROBABILISTIC;
      local_2c8 = std::runtime_error::runtime_error;
      local_2c0 = 0;
      local_2b8 = std::exception::~exception;
      local_2b0 = 0;
      local_2a8 = testing::internal::AssertHelper::AssertHelper;
      local_2a0 = 0;
      uStack_298 = 0;
      local_290 = 0;
      uStack_288 = 0;
      local_280 = 0;
      uStack_278 = 0;
      local_270 = local_270 & 0xfe;
      local_268 = local_268 & 0xf8;
      nlohmann::detail::input_adapter::
      input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                (&local_4b8,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_408._M_dataplus._M_p,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(local_408._M_dataplus._M_p + local_408._M_string_length));
      local_1b8 = (code *)0x0;
      uStack_1b0 = 0;
      local_1c8._M_unused._M_object = (void *)0x0;
      local_1c8._8_8_ = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)local_4a8,&local_4b8,(parser_callback_t *)&local_1c8,true);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,_jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,_0>
                (&local_350);
      jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::operator=
                ((SamplingStrategyResponse *)&local_2d8,(SamplingStrategyResponse *)&local_350);
      jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                ((SamplingStrategyResponse *)&local_350);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_4a8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_4a8 + 8),(value_t)local_4a8[0]);
      if (local_1b8 != (code *)0x0) {
        (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT62(local_4b8.ia.
                   super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi._2_6_,
                   local_4b8.ia.
                   super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi._0_2_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT62(local_4b8.ia.
                            super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._2_6_,
                            local_4b8.ia.
                            super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi._0_2_));
      }
      local_4a8._0_4_ = PROBABILISTIC;
      testing::internal::
      CmpHelperEQ<jaegertracing::sampling_manager::thrift::SamplingStrategyType::type,jaegertracing::sampling_manager::thrift::SamplingStrategyType::type>
                ((internal *)&local_350,
                 "sampling_manager::thrift::SamplingStrategyType::PROBABILISTIC",
                 "response.strategyType",(type *)local_4a8,local_2d0);
      vVar3 = local_350.m_type;
      if ((internal)local_350.m_type == (internal)0x0) {
        testing::Message::Message((Message *)local_4a8);
        if ((undefined8 *)
            CONCAT44(local_350.m_value.number_integer._4_4_,local_350.m_value.number_integer._0_4_)
            == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(local_350.m_value.number_integer._4_4_,
                                      local_350.m_value.number_integer._0_4_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_4b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/MockAgentTest.cpp"
                   ,0x68,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_4b8,(Message *)local_4a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4b8);
        if (((CONCAT44(local_4a8._4_4_,local_4a8._0_4_) != 0) &&
            (cVar4 = testing::internal::IsTrue(true), cVar4 != '\0')) &&
           ((long *)CONCAT44(local_4a8._4_4_,local_4a8._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_4a8._4_4_,local_4a8._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_350.m_value,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                ((SamplingStrategyResponse *)&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p);
      }
      std::
      vector<jaegertracing::net::http::Header,_std::allocator<jaegertracing::net::http::Header>_>::
      ~vector(&local_420);
      if (local_440 != local_430) {
        operator_delete(local_440);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p);
      }
      if (local_370 != local_360) {
        operator_delete(local_370);
      }
      if (local_390 != local_380) {
        operator_delete(local_390);
      }
      if ((undefined1 *)local_3d8._32_8_ != local_3a8) {
        operator_delete((void *)local_3d8._32_8_);
      }
      if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
        operator_delete((void *)local_3d8._0_8_);
      }
      if ((undefined1 *)CONCAT71(local_260._1_7_,local_260.m_type) != local_250) {
        operator_delete((undefined1 *)CONCAT71(local_260._1_7_,local_260.m_type));
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((internal)vVar3 != (internal)0x0) {
        local_2d8 = (code **)std::istream::_M_extract<long>;
        local_2d0[0] = PROBABILISTIC;
        local_2c8 = std::runtime_error::runtime_error;
        local_2c0 = 0;
        local_2b8 = std::exception::~exception;
        local_2b0 = 0;
        local_2a8 = testing::internal::AssertHelper::AssertHelper;
        local_2a0 = 0;
        uStack_298 = 0;
        local_290 = 0;
        uStack_288 = 0;
        local_280 = 0;
        uStack_278 = 0;
        local_270 = local_270 & 0xfe;
        local_268 = local_268 & 0xf8;
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_strategyType
                  ((type)&local_2d8);
        local_4b8.ia.
        super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)std::exception::~exception;
        local_4b8.ia.
        super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_2_ = 0;
        jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy::
        __set_maxTracesPerSecond((short)&local_4b8);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::
        __set_rateLimitingSampling((RateLimitingSamplingStrategy *)&local_2d8);
        MockAgent::
        addSamplingStrategy<char_const(&)[11],jaegertracing::sampling_manager::thrift::SamplingStrategyResponse&>
                  (local_3e8,(char (*) [11])0x1e0010,(SamplingStrategyResponse *)&local_2d8);
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"http://",7);
        memcpy((IPAddress *)local_3d8,local_3e8 + 0x240,0x88);
        net::IPAddress::authority_abi_cxx11_(&local_468,(IPAddress *)local_3d8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_468._M_dataplus._M_p,
                            local_468._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/?service=service123",0x14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p);
        }
        std::__cxx11::stringbuf::str();
        jaegertracing::net::URI::parse((string *)local_3d8);
        jaegertracing::net::http::get((URI *)&local_468);
        local_350._0_8_ = std::istream::_M_extract<long>;
        local_350.m_value.number_integer._0_4_ = 0;
        local_340 = std::runtime_error::runtime_error;
        local_338 = 0;
        local_330 = std::exception::~exception;
        local_328 = 0;
        local_320 = testing::internal::AssertHelper::AssertHelper;
        local_318 = 0;
        uStack_310 = 0;
        local_308 = 0;
        uStack_300 = 0;
        local_2f8 = 0;
        uStack_2f0 = 0;
        local_2e8 = local_2e8 & 0xfe;
        local_2e0 = local_2e0 & 0xf8;
        nlohmann::detail::input_adapter::
        input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                  (&local_478,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_408._M_dataplus._M_p,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(local_408._M_dataplus._M_p + local_408._M_string_length));
        local_1d8 = (code *)0x0;
        uStack_1d0 = 0;
        local_1e8._M_unused._M_object = (void *)0x0;
        local_1e8._8_8_ = 0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_488,&local_478,(parser_callback_t *)&local_1e8,true);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,_jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,_0>
                  (&local_260);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::operator=
                  ((SamplingStrategyResponse *)&local_350,(SamplingStrategyResponse *)&local_260);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                  ((SamplingStrategyResponse *)&local_260);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_488);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_488 + 8),(value_t)local_488[0]);
        if (local_1d8 != (code *)0x0) {
          (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
        }
        if (local_478.ia.
            super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_478.ia.
                     super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        testing::internal::
        CmpHelperEQ<jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,jaegertracing::sampling_manager::thrift::SamplingStrategyResponse>
                  ((internal *)&local_260,"config","response",(SamplingStrategyResponse *)&local_2d8
                   ,(SamplingStrategyResponse *)&local_350);
        if (local_260.m_type == null) {
          testing::Message::Message((Message *)local_488);
          if (local_260.m_value.object == (object_t *)0x0) {
            pbVar7 = (pointer)0x1e3f2c;
          }
          else {
            pbVar7 = ((local_260.m_value.array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_478,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/MockAgentTest.cpp"
                     ,0x7b,(char *)pbVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_478,(Message *)local_488);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_478);
          if (((CONCAT71(local_488._1_7_,local_488[0]) != 0) &&
              (cVar4 = testing::internal::IsTrue(true), cVar4 != '\0')) &&
             ((long *)CONCAT71(local_488._1_7_,local_488[0]) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(local_488._1_7_,local_488[0]) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_260.m_value,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                  ((SamplingStrategyResponse *)&local_350);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        std::
        vector<jaegertracing::net::http::Header,_std::allocator<jaegertracing::net::http::Header>_>
        ::~vector(&local_420);
        if (local_440 != local_430) {
          operator_delete(local_440);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p);
        }
        if (local_370 != local_360) {
          operator_delete(local_370);
        }
        if (local_390 != local_380) {
          operator_delete(local_390);
        }
        if ((undefined1 *)local_3d8._32_8_ != local_3a8) {
          operator_delete((void *)local_3d8._32_8_);
        }
        if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
          operator_delete((void *)local_3d8._0_8_);
        }
        if ((undefined1 *)CONCAT44(local_4a8._4_4_,local_4a8._0_4_) != local_498) {
          operator_delete((undefined1 *)CONCAT44(local_4a8._4_4_,local_4a8._0_4_));
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy::
        ~RateLimitingSamplingStrategy((RateLimitingSamplingStrategy *)&local_4b8);
        jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
                  ((SamplingStrategyResponse *)&local_2d8);
      }
      goto LAB_001c336d;
    }
    testing::Message::Message((Message *)&local_260);
    if ((undefined8 *)
        CONCAT44(local_350.m_value.number_integer._4_4_,local_350.m_value.number_integer._0_4_) ==
        (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(local_350.m_value.number_integer._4_4_,
                                  local_350.m_value.number_integer._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/MockAgentTest.cpp"
               ,0x5c,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4a8,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4a8);
    if (((CONCAT71(local_260._1_7_,local_260.m_type) != 0) &&
        (cVar4 = testing::internal::IsTrue(true), cVar4 != '\0')) &&
       ((long *)CONCAT71(local_260._1_7_,local_260.m_type) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_260._1_7_,local_260.m_type) + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_350.m_value,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    std::vector<jaegertracing::net::http::Header,_std::allocator<jaegertracing::net::http::Header>_>
    ::~vector(&local_420);
    if (local_440 != local_430) {
      operator_delete(local_440);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != paVar1) {
      operator_delete(local_468._M_dataplus._M_p);
    }
    if (local_370 != local_360) {
      operator_delete(local_370);
    }
    if (local_390 != local_380) {
      operator_delete(local_390);
    }
    if ((undefined1 *)local_3d8._32_8_ != local_3a8) {
      operator_delete((void *)local_3d8._32_8_);
    }
    if ((undefined1 *)local_3d8._0_8_ != puVar2) {
      operator_delete((void *)local_3d8._0_8_);
    }
    if (local_2d8 != &local_2c8) goto LAB_001c3347;
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_001c336d:
  if (local_3e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e0);
  }
  return;
}

Assistant:

TEST(MockAgent, testSamplingManager)
{
    auto mockAgent = MockAgent::make();
    mockAgent->start();

    {
        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << '/';
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto response = net::http::get(uri);
        ASSERT_EQ("no 'service' parameter", response.body());
    }
    {
        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << "/?service=a&service=b";
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto response = net::http::get(uri);
        ASSERT_EQ("'service' parameter must occur only once", response.body());
    }
    {
        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << "/?service=something";
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto responseHTTP = net::http::get(uri);
        sampling_manager::thrift::SamplingStrategyResponse response;
        response = nlohmann::json::parse(responseHTTP.body());
        ASSERT_EQ(sampling_manager::thrift::SamplingStrategyType::PROBABILISTIC,
                  response.strategyType);
    }
    {
        sampling_manager::thrift::SamplingStrategyResponse config;
        config.__set_strategyType(
            sampling_manager::thrift::SamplingStrategyType::RATE_LIMITING);
        sampling_manager::thrift::RateLimitingSamplingStrategy rateLimiting;
        rateLimiting.__set_maxTracesPerSecond(123);
        config.__set_rateLimitingSampling(rateLimiting);
        mockAgent->addSamplingStrategy("service123", config);

        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << "/?service=service123";
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto responseHTTP = net::http::get(uri);
        sampling_manager::thrift::SamplingStrategyResponse response;
        response = nlohmann::json::parse(responseHTTP.body());
        ASSERT_EQ(config, response);
    }
}